

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

vector<Vector3<double>,_std::allocator<Vector3<double>_>_> * __thiscall
s2coding::EncodedS2PointVector::Decode
          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__return_storage_ptr__,
          EncodedS2PointVector *this)

{
  S2Point local_48;
  uint local_30;
  int i;
  undefined1 local_19;
  EncodedS2PointVector *local_18;
  EncodedS2PointVector *this_local;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points;
  
  local_19 = 0;
  local_18 = this;
  this_local = (EncodedS2PointVector *)__return_storage_ptr__;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector(__return_storage_ptr__);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (__return_storage_ptr__,(ulong)this->size_);
  for (local_30 = 0; local_30 < this->size_; local_30 = local_30 + 1) {
    operator[](&local_48,this,local_30);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              (__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Point> EncodedS2PointVector::Decode() const {
  vector<S2Point> points;
  points.reserve(size_);
  for (int i = 0; i < size_; ++i) {
    points.push_back((*this)[i]);
  }
  return points;
}